

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Trigger * sqlite3TriggerList(Parse *pParse,Table *pTab)

{
  byte bVar1;
  Parse *pPVar2;
  Trigger *pTVar3;
  Trigger *pTVar4;
  long *in_RDX;
  long *plVar5;
  Schema *pTmpSchema;
  long lVar6;
  
  if ((char)pTab != '\0') {
    return (Trigger *)0x0;
  }
  pPVar2 = (Parse *)in_RDX[0xe];
  if ((pPVar2 != pParse) && (plVar5 = *(long **)&pParse->iSelfTab, plVar5 != (long *)0x0)) {
    pTVar4 = (Trigger *)0x0;
LAB_0019f85a:
    pTVar3 = (Trigger *)plVar5[2];
    if ((Parse *)pTVar3->pTabSchema == pPVar2) {
      lVar6 = 0;
      do {
        bVar1 = pTVar3->table[lVar6];
        if (bVar1 == *(byte *)(*in_RDX + lVar6)) {
          if ((ulong)bVar1 == 0) goto LAB_0019f892;
        }
        else if (""[bVar1] != ""[*(byte *)(*in_RDX + lVar6)]) break;
        lVar6 = lVar6 + 1;
      } while( true );
    }
    goto LAB_0019f8a2;
  }
LAB_0019f8b3:
  return (Trigger *)in_RDX[0xd];
LAB_0019f892:
  if (pTVar4 == (Trigger *)0x0) {
    pTVar4 = (Trigger *)in_RDX[0xd];
  }
  pTVar3->pNext = pTVar4;
  pTVar4 = pTVar3;
LAB_0019f8a2:
  plVar5 = (long *)*plVar5;
  if (plVar5 == (long *)0x0) goto code_r0x0019f8aa;
  goto LAB_0019f85a;
code_r0x0019f8aa:
  if (pTVar4 != (Trigger *)0x0) {
    return pTVar4;
  }
  goto LAB_0019f8b3;
}

Assistant:

SQLITE_PRIVATE Trigger *sqlite3TriggerList(Parse *pParse, Table *pTab){
  Schema * const pTmpSchema = pParse->db->aDb[1].pSchema;
  Trigger *pList = 0;                  /* List of triggers to return */

  if( pParse->disableTriggers ){
    return 0;
  }

  if( pTmpSchema!=pTab->pSchema ){
    HashElem *p;
    assert( sqlite3SchemaMutexHeld(pParse->db, 0, pTmpSchema) );
    for(p=sqliteHashFirst(&pTmpSchema->trigHash); p; p=sqliteHashNext(p)){
      Trigger *pTrig = (Trigger *)sqliteHashData(p);
      if( pTrig->pTabSchema==pTab->pSchema
       && 0==sqlite3StrICmp(pTrig->table, pTab->zName) 
      ){
        pTrig->pNext = (pList ? pList : pTab->pTrigger);
        pList = pTrig;
      }
    }
  }

  return (pList ? pList : pTab->pTrigger);
}